

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * Matrix::multiply(double *x1,size_t x1Length,double *x2,size_t x2Length)

{
  size_t i;
  Matrix *this;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  double sum;
  double dVar4;
  
  this = (Matrix *)operator_new(0x18);
  Matrix(this,x1Length,x2Length,false);
  for (sVar1 = 0; sVar1 != x1Length; sVar1 = sVar1 + 1) {
    for (sVar2 = 0; sVar2 != x2Length; sVar2 = sVar2 + 1) {
      dVar4 = 0.0;
      for (sVar3 = 0; x2Length != sVar3; sVar3 = sVar3 + 1) {
        dVar4 = dVar4 + x2[sVar3] * x1[sVar1];
      }
      this->data[sVar1 * x2Length + sVar2] = dVar4;
    }
  }
  return this;
}

Assistant:

Matrix* Matrix::multiply(double* x1, size_t x1Length, double* x2, size_t x2Length) {
	if (1 != 1) {
		std::cout << "Cols don't match rows" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(x1Length, x2Length);
	for (size_t i = 0; i < x1Length; i++) {
		for (size_t j = 0; j < x2Length; j++) {
			double sum = 0;
			for (size_t k = 0; k < x2Length; ++k) {
				sum += x1[i] * x2[k];
			}
			matrix->data[i * x2Length + j] = sum;
		}
	}
	return matrix;
}